

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::Tree(Tree *this,Tree *that)

{
  undefined8 *puVar1;
  pfn_allocate p_Var2;
  pfn_free p_Var3;
  pfn_error p_Var4;
  long lVar5;
  EVP_PKEY_CTX *in_RDX;
  
  this->m_buf = (NodeData *)0x0;
  this->m_cap = 0;
  this->m_size = 0;
  *(undefined4 *)&this->m_free_head = 0xffffffff;
  *(undefined4 *)((long)&this->m_free_head + 4) = 0xffffffff;
  *(undefined4 *)&this->m_free_tail = 0xffffffff;
  *(undefined4 *)((long)&this->m_free_tail + 4) = 0xffffffff;
  (this->m_arena).str = (char *)0x0;
  (this->m_arena).len = 0;
  this->m_arena_pos = 0;
  p_Var2 = (that->m_callbacks).m_allocate;
  p_Var3 = (that->m_callbacks).m_free;
  p_Var4 = (that->m_callbacks).m_error;
  (this->m_callbacks).m_user_data = (that->m_callbacks).m_user_data;
  (this->m_callbacks).m_allocate = p_Var2;
  (this->m_callbacks).m_free = p_Var3;
  (this->m_callbacks).m_error = p_Var4;
  lVar5 = 0x60;
  do {
    puVar1 = (undefined8 *)((long)(this->m_tag_directives + -2) + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->m_tag_directives + lVar5 + -0x60);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0x100);
  _copy(this,(EVP_PKEY_CTX *)that,in_RDX);
  return;
}

Assistant:

Tree::Tree(Tree const& that) noexcept : Tree(that.m_callbacks)
{
    _copy(that);
}